

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

int Fxch_ManComputeLevelDiv(Fxch_Man_t *pFxchMan,Vec_Int_t *vCubeFree)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (iVar2 = 0; iVar2 < vCubeFree->nSize; iVar2 = iVar2 + 1) {
    iVar1 = Vec_IntEntry(vCubeFree,iVar2);
    p = pFxchMan->vLevels;
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Vec_IntEntry(p,iVar1);
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
  }
  iVar2 = 800;
  if (iVar3 < 800) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int Fxch_ManComputeLevelDiv( Fxch_Man_t* pFxchMan,
                             Vec_Int_t* vCubeFree )
{
    int i,
        Lit,
        Level = 0;

    Vec_IntForEachEntry( vCubeFree, Lit, i )
        Level = Abc_MaxInt( Level, Vec_IntEntry( pFxchMan->vLevels, Abc_Lit2Var( Abc_Lit2Var( Lit ) ) ) );

    return Abc_MinInt( Level, 800 );
}